

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O0

bool __thiscall
InliningDecider::ContinueInliningUserDefinedFunctions
          (InliningDecider *this,uint32 bytecodeInlinedCount)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  int iVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  uint32 bytecodeInlinedCount_local;
  InliningDecider *this_local;
  
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlinePhase,uVar3,LVar4);
  if ((bVar2) || (bytecodeInlinedCount <= (uint)(this->threshold).inlineCountMax)) {
    this_local._7_1_ = true;
  }
  else {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar3,LVar4);
    if (bVar2) {
      uVar1 = (this->threshold).inlineCountMax;
      iVar5 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7]
              )();
      pcVar6 = Js::FunctionProxy::GetDebugNumberSet
                         ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_78);
      Output::Print(L"INLINING: Skip Inline: InlineCountMax threshold %d, reached: %s (#%s)\n",
                    (ulong)uVar1,CONCAT44(extraout_var,iVar5),pcVar6);
      Output::Flush();
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InliningDecider::ContinueInliningUserDefinedFunctions(uint32 bytecodeInlinedCount) const
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    if (PHASE_FORCE(Js::InlinePhase, this->topFunc) || bytecodeInlinedCount <= (uint)this->threshold.inlineCountMax)
    {
        return true;
    }

    INLINE_TESTTRACE(_u("INLINING: Skip Inline: InlineCountMax threshold %d, reached: %s (#%s)\n"),
        (uint)this->threshold.inlineCountMax,
        this->topFunc->GetDisplayName(), this->topFunc->GetDebugNumberSet(debugStringBuffer));

    return false;
}